

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxObjectiveFunction.cpp
# Opt level: O0

RealType __thiscall
OpenMD::BoxObjectiveFunction::valueAndGradient
          (BoxObjectiveFunction *this,DynamicVector<double,_std::allocator<double>_> *grad,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  int iVar1;
  SnapshotManager *pSVar2;
  reference pvVar3;
  Shake *in_RDX;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  double i;
  int j;
  Shake *in_stack_00000050;
  FluctuatingChargeConstraints *in_stack_00000080;
  DynamicVector<double,_std::allocator<double>_> *in_stack_000001f8;
  BoxObjectiveFunction *in_stack_00000200;
  DynamicVector<double,_std::allocator<double>_> *in_stack_00000510;
  BoxObjectiveFunction *in_stack_00000518;
  int local_24;
  RealType local_8;
  
  pSVar2 = SimInfo::getSnapshotManager
                     ((SimInfo *)
                      (in_RDI->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  (*pSVar2->_vptr_SnapshotManager[2])();
  iVar1 = setCoor(in_stack_00000518,in_stack_00000510);
  if (iVar1 == 0) {
    Shake::constraintR(in_RDX);
    (**(code **)((long)*(in_RDI->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 0x10))();
    if (((ulong)in_RDI[2].data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start & 1) != 0) {
      FluctuatingChargeConstraints::applyConstraints(in_stack_00000080);
    }
    Shake::constraintF(in_stack_00000050);
    getGrad(in_stack_00000200,in_stack_000001f8);
    local_8 = Thermo::getPotential((Thermo *)in_RDI);
  }
  else {
    for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
      i = std::numeric_limits<double>::infinity();
      pvVar3 = DynamicVector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)i);
      *pvVar3 = i;
    }
    local_8 = std::numeric_limits<double>::infinity();
  }
  return local_8;
}

Assistant:

RealType BoxObjectiveFunction::valueAndGradient(
      DynamicVector<RealType>& grad, const DynamicVector<RealType>& x) {
    info_->getSnapshotManager()->advance();
    if (setCoor(x) == 0) {
      shake_->constraintR();
      forceMan_->calcForces();
      if (hasFlucQ_) fqConstraints_->applyConstraints();
      shake_->constraintF();
      getGrad(grad);
      return thermo.getPotential();
    } else {
      // The deformation was too large, so return infinite
      // potential and gradient
      for (int j = 0; j < 6; j++)
        grad[j] = std::numeric_limits<RealType>::infinity();
      return std::numeric_limits<RealType>::infinity();
    }
  }